

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

ssize_t __thiscall
higan::HttpServer::SendFileInternal
          (HttpServer *this,TcpConnectionPtr *connection,FileContextPtr *file_ptr)

{
  size_t sVar1;
  LogLevel LVar2;
  element_type *this_00;
  ssize_t sVar3;
  element_type *this_01;
  size_t index;
  Logger local_4a8;
  Logger local_290;
  size_t local_68;
  ssize_t result;
  Buffer send_buffer;
  ssize_t sum_send_size;
  ssize_t send_size;
  ssize_t read_size;
  FileContextPtr *file_ptr_local;
  TcpConnectionPtr *connection_local;
  HttpServer *this_local;
  
  send_buffer.write_idx_ = 0;
  Buffer::Buffer((Buffer *)&result);
  local_68 = 0xffffffffffffffff;
  do {
    this_00 = std::__shared_ptr_access<higan::FileContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<higan::FileContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)file_ptr);
    sVar3 = FileContext::ReadFileToBuffer(this_00,(Buffer *)&result);
    if (sVar3 == 0) {
      local_68 = 0;
      sVar1 = local_68;
      break;
    }
    if (sVar3 < 0) {
      LVar2 = Logger::GetLogLevel();
      if ((int)LVar2 < 4) {
        Logger::Logger(&local_290,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/http/HttpServer.cpp"
                       ,0x73,"SendFileInternal");
        Logger::operator<<(&local_290,"read file error");
        Logger::~Logger(&local_290);
      }
      local_68 = 0xffffffffffffffff;
      sVar1 = local_68;
      break;
    }
    this_01 = std::
              __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)connection);
    index = TcpConnection::Send(this_01,(Buffer *)&result);
    Buffer::AddReadIndex((Buffer *)&result,index);
    send_buffer.write_idx_ = index + send_buffer.write_idx_;
    if (index == 0xffffffffffffffff) {
      LVar2 = Logger::GetLogLevel();
      if ((int)LVar2 < 4) {
        Logger::Logger(&local_4a8,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/http/HttpServer.cpp"
                       ,0x7e,"SendFileInternal");
        Logger::operator<<(&local_4a8,"send file error");
        Logger::~Logger(&local_4a8);
      }
      local_68 = 0xffffffffffffffff;
      sVar1 = local_68;
      break;
    }
    sVar1 = send_buffer.write_idx_;
  } while (sVar3 <= (long)index);
  local_68 = sVar1;
  sVar1 = local_68;
  Buffer::~Buffer((Buffer *)&result);
  return sVar1;
}

Assistant:

ssize_t HttpServer::SendFileInternal(const TcpConnectionPtr& connection, const FileContext::FileContextPtr& file_ptr)
{
	ssize_t read_size = -1;
	ssize_t send_size = -1;
	ssize_t sum_send_size = 0;
	Buffer send_buffer;

	ssize_t result = -1;

	while (true)
	{
		read_size = file_ptr->ReadFileToBuffer(&send_buffer);
		if (read_size == 0)
		{
			result = 0;
			break;
		}
		else if (read_size < 0)
		{
			LOG_ERROR << "read file error";
			result = -1;
			break;
		}

		send_size = connection->Send(&send_buffer);
		send_buffer.AddReadIndex(send_size);
		sum_send_size += send_size;

		if (send_size == -1)
		{
			LOG_ERROR << "send file error";
			result = -1;
			break;
		}
		else if (send_size < read_size)
		{
			result =  sum_send_size;
			break;
		}
	}
	return result;
}